

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall
CTcSymBifBase::CTcSymBifBase
          (CTcSymBifBase *this,char *str,size_t len,int copy,ushort func_set_id,ushort func_idx,
          int has_retval,int min_argc,int max_argc,int varargs)

{
  CTcSymbol::CTcSymbol(&this->super_CTcSymbol,str,len,copy,TC_SYM_BIF);
  (this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
  _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00342468;
  this->func_set_id_ = func_set_id;
  this->func_idx_ = func_idx;
  this->min_argc_ = min_argc;
  this->max_argc_ = max_argc;
  this->field_0x34 = (byte)varargs & 1 | this->field_0x34 & 0xfc | (char)has_retval * '\x02' & 2U;
  return;
}

Assistant:

CTcSymBifBase(const char *str, size_t len, int copy,
                  ushort func_set_id, ushort func_idx, int has_retval,
                  int min_argc, int max_argc, int varargs)
        : CTcSymbol(str, len, copy, TC_SYM_BIF)
    {
        func_set_id_ = func_set_id;
        func_idx_ = func_idx;
        has_retval_ = has_retval;
        min_argc_ = min_argc;
        max_argc_ = max_argc;
        varargs_ = varargs;
    }